

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>>
  *p_Var2;
  code *pcVar3;
  element_type *peVar4;
  ostream *poVar5;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar6;
  shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>_>
  bot;
  shared_ptr<asio::io_context> aioc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  code *local_3c0 [2];
  _Manager_type local_3b0;
  code *local_3a8;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_3a0;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_390;
  undefined1 local_380 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_378;
  state local_370;
  undefined1 local_368 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_360;
  state local_358;
  undefined1 local_350 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_348;
  state local_340;
  undefined1 local_338 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_330;
  state local_328;
  element_type *local_320;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_318;
  _Alloc_node __an;
  undefined1 local_300 [24];
  undefined4 local_2e8;
  omittable_field<int> local_2e0;
  omittable_field<int> local_2c8;
  omittable_field<int> local_2b0;
  omittable_field<bool> local_298;
  nullable_omittable_field<int> local_280;
  omittable_field<bool> local_268;
  omittable_field<bool> local_250;
  omittable_field<bool> local_238;
  string token;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_200;
  User *local_1f8;
  code *local_1f0;
  code *local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e0;
  undefined8 local_1d8;
  code *local_1d0;
  code *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  undefined8 local_1b8;
  code *local_1b0;
  code *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  undefined8 local_198;
  code *local_190;
  code *local_188;
  User self;
  
  discordpp::log::filter = 2;
  discordpp::log::out = (undefined *)&std::cerr;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Howdy, and thanks for trying out Discord++!\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Feel free to drop into the official server at https://discord.gg/4stCdkDHw6 if you have any questions.\n\n"
             ,0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Starting bot...\n\n",0x11);
  getToken_abi_cxx11_();
  if (token._M_string_length != 0) {
    bot.
    super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>>,std::allocator<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>>>>
              (&bot.
                super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               (PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>
                **)&bot,(allocator<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>_>
                         *)&self);
    (&((bot.
        super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->
      super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
      ).
      super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
      .field_0x8)
    [*(long *)(*(long *)&((bot.
                           super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->
                         super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                         ).
                         super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
              + -0x18)] = 1;
    *(undefined2 *)
     &((bot.
        super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->
      super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
      ).
      super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
      .field_0x6a = 0x200;
    local_300._16_8_ = (_Base_ptr)0x0;
    local_2e8 = 0;
    local_390.t_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    local_390.s_ = uninitialized_e;
    local_3a0.t_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    local_3a0.s_ = uninitialized_e;
    local_330._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_328 = uninitialized_e;
    local_338 = (undefined1  [8])&PTR_operator__0024a208;
    local_238.super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t
    .super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<bool,_std::default_delete<bool>,_true,_true>)
         (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0;
    local_238.super_field<bool>.s_ = omitted_e;
    local_238._vptr_omittable_field = (_func_int **)&PTR_operator__0024a260;
    local_250.super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t
    .super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<bool,_std::default_delete<bool>,_true,_true>)
         (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0;
    local_250.super_field<bool>.s_ = omitted_e;
    local_250._vptr_omittable_field = (_func_int **)&PTR_operator__0024a260;
    local_268.super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t
    .super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<bool,_std::default_delete<bool>,_true,_true>)
         (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0;
    local_268.super_field<bool>.s_ = omitted_e;
    local_268._vptr_omittable_field = (_func_int **)&PTR_operator__0024a260;
    local_348._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_340 = omitted_e;
    local_350 = (undefined1  [8])&PTR_operator__0024a2b0;
    local_280.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                   (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
    local_280.super_field<int>.s_ = omitted_e;
    local_280._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024a300;
    local_360._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_358 = omitted_e;
    local_368 = (undefined1  [8])&PTR_operator__0024a360;
    local_298.super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t
    .super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<bool,_std::default_delete<bool>,_true,_true>)
         (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0;
    local_298.super_field<bool>.s_ = omitted_e;
    local_298._vptr_omittable_field = (_func_int **)&PTR_operator__0024a260;
    local_378._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_370 = omitted_e;
    local_380 = (undefined1  [8])&PTR_operator__0024a2b0;
    local_2b0.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                   (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
    local_2c8.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                   (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
    local_2e0.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                   (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
    local_2b0.super_field<int>.s_ = omitted_e;
    local_2c8.super_field<int>.s_ = omitted_e;
    local_2e0.super_field<int>.s_ = omitted_e;
    local_2b0._vptr_omittable_field = (_func_int **)&PTR_operator__0024a3a0;
    local_2c8._vptr_omittable_field = (_func_int **)&PTR_operator__0024a3a0;
    local_2e0._vptr_omittable_field = (_func_int **)&PTR_operator__0024a3a0;
    discordpp::User::User
              (&self,(field<discordpp::Snowflake> *)(local_300 + 0x10),&local_390,&local_3a0,
               (nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_338,&local_238,&local_250,&local_268,
               (nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_350,&local_280,
               (omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_368,&local_298,
               (nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_380,&local_2b0,&local_2c8,&local_2e0);
    if ((_Head_base<0UL,_int_*,_false>)
        local_2e0.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
        _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0) {
      operator_delete((void *)local_2e0.super_field<int>.t_._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl,4);
    }
    local_2e0.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                   (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
    if ((_Tuple_impl<0UL,_int_*,_std::default_delete<int>_>)
        local_2c8.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
        _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
      operator_delete((void *)local_2c8.super_field<int>.t_._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl,4);
    }
    local_2c8.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                   (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
    if (local_2b0.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
        _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0) {
      operator_delete((void *)local_2b0.super_field<int>.t_._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl,4);
    }
    local_2b0.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                   (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
    if (local_378._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_378,local_378._M_head_impl);
    }
    local_378._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_298.super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
        _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0) {
      operator_delete((void *)local_298.super_field<bool>.t_._M_t.
                              super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
                              super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
                              super__Head_base<0UL,_bool_*,_false>._M_head_impl,1);
    }
    local_298.super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t
    .super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<bool,_std::default_delete<bool>,_true,_true>)
         (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0;
    if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_360._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_360,local_360._M_head_impl);
    }
    local_360._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((_Tuple_impl<0UL,_int_*,_std::default_delete<int>_>)
        local_280.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
        _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
      operator_delete((void *)local_280.super_field<int>.t_._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl,4);
    }
    local_280.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                   (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
    if (local_348._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_348,local_348._M_head_impl);
    }
    local_348._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_268.super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
        _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0) {
      operator_delete((void *)local_268.super_field<bool>.t_._M_t.
                              super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
                              super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
                              super__Head_base<0UL,_bool_*,_false>._M_head_impl,1);
    }
    local_268.super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t
    .super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<bool,_std::default_delete<bool>,_true,_true>)
         (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0;
    if (local_250.super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
        _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0) {
      operator_delete((void *)local_250.super_field<bool>.t_._M_t.
                              super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
                              super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
                              super__Head_base<0UL,_bool_*,_false>._M_head_impl,1);
    }
    local_250.super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t
    .super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<bool,_std::default_delete<bool>,_true,_true>)
         (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0;
    if ((_Head_base<0UL,_bool_*,_false>)
        local_238.super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
        _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl != (_Head_base<0UL,_bool_*,_false>)0x0) {
      operator_delete((void *)local_238.super_field<bool>.t_._M_t.
                              super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
                              super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
                              super__Head_base<0UL,_bool_*,_false>._M_head_impl,1);
    }
    local_238.super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t
    .super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<bool,_std::default_delete<bool>,_true,_true>)
         (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0;
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_330._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_330,local_330._M_head_impl);
    }
    local_330._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_3a0.t_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_3a0.t_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
    local_3a0.t_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (local_390.t_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_390,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_390.t_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
    local_390.t_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if ((_Base_ptr)local_300._16_8_ != (_Base_ptr)0x0) {
      operator_delete((void *)local_300._16_8_,8);
    }
    local_300._16_8_ = (_Base_ptr)0x0;
    local_3d0._M_allocated_capacity._0_4_ = 0x44414552;
    local_3d0._M_allocated_capacity._4_2_ = 0x59;
    aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
    local_3c0[1] = (code *)0x0;
    local_3a8 = std::
                _Function_handler<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/main.cc:57:19)>
                ::_M_invoke;
    local_3b0 = std::
                _Function_handler<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/main.cc:57:19)>
                ::_M_manager;
    p_Var2 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>>
              *)(&((bot.
                    super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->
                  super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                  ).
                  super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                  .field_0x10 +
                *(long *)(*(long *)&((bot.
                                      super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->
                                    super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                                    ).
                                    super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                         + -0x18));
    aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_3d0;
    local_3c0[0] = (code *)&self;
    pVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
            ::_M_get_insert_equal_pos
                      ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
                        *)p_Var2,(key_type *)&aioc);
    __an._M_t = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
                 *)p_Var2;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>>
    ::
    _M_insert_<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>>::_Alloc_node>
              (p_Var2,pVar6.first,pVar6.second,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
                *)&aioc,&__an);
    if (local_3b0 != (_Manager_type)0x0) {
      (*local_3b0)((_Any_data *)local_3c0,(_Any_data *)local_3c0,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        &local_3d0) {
      operator_delete(aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      CONCAT26(local_3d0._M_allocated_capacity._6_2_,
                               CONCAT24(local_3d0._M_allocated_capacity._4_2_,
                                        local_3d0._M_allocated_capacity._0_4_)) + 1);
    }
    std::__cxx11::string::_M_replace
              ((ulong)&((bot.
                         super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->
                       super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                       ).
                       super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                       .prefix,0,
               (char *)((bot.
                         super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->
                       super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                       ).
                       super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                       .prefix._M_string_length,0x1e79f0);
    peVar4 = bot.
             super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_3d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&aioc,"help","");
    __an._M_t = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
                 *)local_300;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__an,"Mention me and I\'ll echo your message back!","");
    (**(code **)(*(long *)&(peVar4->
                           super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                           ).
                           super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                + 0x88))(peVar4,&aioc,&__an);
    if (__an._M_t !=
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
         *)local_300) {
      operator_delete(__an._M_t,local_300._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        &local_3d0) {
      operator_delete(aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      CONCAT26(local_3d0._M_allocated_capacity._6_2_,
                               CONCAT24(local_3d0._M_allocated_capacity._4_2_,
                                        local_3d0._M_allocated_capacity._0_4_)) + 1);
    }
    peVar4 = bot.
             super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_3d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&aioc,"about","");
    local_198 = 0;
    local_188 = std::
                _Function_handler<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/main.cc:63:27)>
                ::_M_invoke;
    local_190 = std::
                _Function_handler<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/main.cc:63:27)>
                ::_M_manager;
    local_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&bot;
    (**(code **)(*(long *)&(peVar4->
                           super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                           ).
                           super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                + 0x80))(peVar4,&aioc);
    if (local_190 != (code *)0x0) {
      (*local_190)(&local_1a0,&local_1a0,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        &local_3d0) {
      operator_delete(aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      CONCAT26(local_3d0._M_allocated_capacity._6_2_,
                               CONCAT24(local_3d0._M_allocated_capacity._4_2_,
                                        local_3d0._M_allocated_capacity._0_4_)) + 1);
    }
    peVar4 = bot.
             super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_3d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&aioc,"lookatthis","");
    local_1b8 = 0;
    local_1a8 = std::
                _Function_handler<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/main.cc:78:32)>
                ::_M_invoke;
    local_1b0 = std::
                _Function_handler<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/main.cc:78:32)>
                ::_M_manager;
    local_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&bot;
    (**(code **)(*(long *)&(peVar4->
                           super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                           ).
                           super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                + 0x80))(peVar4,&aioc);
    if (local_1b0 != (code *)0x0) {
      (*local_1b0)(&local_1c0,&local_1c0,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        &local_3d0) {
      operator_delete(aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      CONCAT26(local_3d0._M_allocated_capacity._6_2_,
                               CONCAT24(local_3d0._M_allocated_capacity._4_2_,
                                        local_3d0._M_allocated_capacity._0_4_)) + 1);
    }
    peVar4 = bot.
             super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_3d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&aioc,"channelinfo","");
    local_1d8 = 0;
    local_1c8 = std::
                _Function_handler<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/main.cc:99:33)>
                ::_M_invoke;
    local_1d0 = std::
                _Function_handler<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/main.cc:99:33)>
                ::_M_manager;
    local_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&bot;
    (**(code **)(*(long *)&(peVar4->
                           super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                           ).
                           super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                + 0x80))(peVar4,&aioc);
    if (local_1d0 != (code *)0x0) {
      (*local_1d0)(&local_1e0,&local_1e0,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        &local_3d0) {
      operator_delete(aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      CONCAT26(local_3d0._M_allocated_capacity._6_2_,
                               CONCAT24(local_3d0._M_allocated_capacity._4_2_,
                                        local_3d0._M_allocated_capacity._0_4_)) + 1);
    }
    peVar4 = bot.
             super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_3d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&aioc,"registerslash","");
    local_1e8 = std::
                _Function_handler<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/main.cc:111:35)>
                ::_M_invoke;
    local_1f0 = std::
                _Function_handler<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/main.cc:111:35)>
                ::_M_manager;
    local_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&bot;
    local_1f8 = &self;
    (**(code **)(*(long *)&(peVar4->
                           super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                           ).
                           super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                + 0x80))(peVar4,&aioc);
    if (local_1f0 != (code *)0x0) {
      (*local_1f0)(&local_200,&local_200,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        &local_3d0) {
      operator_delete(aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      CONCAT26(local_3d0._M_allocated_capacity._6_2_,
                               CONCAT24(local_3d0._M_allocated_capacity._4_2_,
                                        local_3d0._M_allocated_capacity._0_4_)) + 1);
    }
    p_Var1 = &aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0xc3c56176dc27028;
    local_3d0._M_allocated_capacity._0_4_ = 0;
    local_3d0._M_allocated_capacity._4_2_ = 0;
    local_3d0._M_allocated_capacity._6_2_ = 0;
    local_3c0[0] = std::
                   _Function_handler<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/main.cc:131:30)>
                   ::_M_invoke;
    local_3d0._8_6_ = 0x11884a;
    local_3d0._M_local_buf[0xe] = '\0';
    local_3d0._M_local_buf[0xf] = '\0';
    aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&bot;
    std::
    _Rb_tree<discordpp::Snowflake,std::pair<discordpp::Snowflake_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>,std::_Select1st<std::pair<discordpp::Snowflake_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>,std::less<discordpp::Snowflake>,std::allocator<std::pair<discordpp::Snowflake_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>>
    ::
    _M_insert_equal<std::pair<discordpp::Snowflake_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>
              ((_Rb_tree<discordpp::Snowflake,std::pair<discordpp::Snowflake_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>,std::_Select1st<std::pair<discordpp::Snowflake_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>,std::less<discordpp::Snowflake>,std::allocator<std::pair<discordpp::Snowflake_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>>
                *)&((bot.
                     super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->
                   super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                   ).
                   super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                   .field_0xc8,
               (pair<const_discordpp::Snowflake,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
                *)&aioc);
    pcVar3 = (code *)CONCAT17(local_3d0._M_local_buf[0xf],
                              CONCAT16(local_3d0._M_local_buf[0xe],local_3d0._8_6_));
    if (pcVar3 != (code *)0x0) {
      (*pcVar3)(p_Var1,p_Var1,3);
    }
    local_3d0._M_allocated_capacity._0_4_ = 0x5353454d;
    local_3d0._M_allocated_capacity._4_2_ = 0x4741;
    local_3d0._M_allocated_capacity._6_2_ = 0x5f45;
    local_3d0._8_6_ = 0x455441455243;
    aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xe;
    local_3d0._M_local_buf[0xe] = '\0';
    local_3a8 = std::
                _Function_handler<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/main.cc:147:28)>
                ::_M_invoke;
    local_3b0 = std::
                _Function_handler<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/main.cc:147:28)>
                ::_M_manager;
    p_Var2 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>>
              *)(&((bot.
                    super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->
                  super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                  ).
                  super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                  .field_0x10 +
                *(long *)(*(long *)&((bot.
                                      super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->
                                    super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                                    ).
                                    super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                         + -0x18));
    aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_3d0;
    local_3c0[0] = (code *)&bot;
    local_3c0[1] = (code *)&self;
    pVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
            ::_M_get_insert_equal_pos
                      ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
                        *)p_Var2,(key_type *)&aioc);
    __an._M_t = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
                 *)p_Var2;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>>
    ::
    _M_insert_<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>>>::_Alloc_node>
              (p_Var2,pVar6.first,pVar6.second,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
                *)&aioc,&__an);
    if (local_3b0 != (_Manager_type)0x0) {
      (*local_3b0)((_Any_data *)local_3c0,(_Any_data *)local_3c0,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        &local_3d0) {
      operator_delete(aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      CONCAT26(local_3d0._M_allocated_capacity._6_2_,
                               CONCAT24(local_3d0._M_allocated_capacity._4_2_,
                                        local_3d0._M_allocated_capacity._0_4_)) + 1);
    }
    aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<asio::io_context,std::allocator<asio::io_context>>
              (&aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (io_context **)&aioc,(allocator<asio::io_context> *)&__an);
    local_320 = aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_318 = aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
    if (aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    (*(code *)**(undefined8 **)
                &((bot.
                   super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->
                 super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                 ).
                 super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
    )(bot.
      super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr,9,&token,&local_320);
    if (local_318 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_318);
    }
    discordpp::BotStruct::run
              ((BotStruct *)
               (&((bot.
                   super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->
                 super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                 ).
                 super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                 .field_0x0 +
               *(long *)(*(long *)&((bot.
                                     super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->
                                   super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                                   ).
                                   super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                        + -0x18)));
    if (aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    discordpp::User::~User(&self);
    if (bot.
        super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (bot.
                 super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)token._M_dataplus._M_p != &token.field_2) {
      operator_delete(token._M_dataplus._M_p,token.field_2._M_allocated_capacity + 1);
    }
    return 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"CRITICAL: ",10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "There is no valid way for Echo to obtain a token! Use one of the following ways:",0x50
            );
  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "(1) Fill the BOT_TOKEN environment variable with the token (e.g. \'Bot 123456abcdef\')."
             ,0x55);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<(poVar5,
                  "(2) Copy the example `token.eg.dat` as `token.dat` and write your own token to it.\n"
                 );
  exit(1);
}

Assistant:

int main() {
    dpp::log::filter = dpp::log::info;
    dpp::log::out = &std::cerr;

    std::cout << "Howdy, and thanks for trying out Discord++!\n"
              << "Feel free to drop into the official server at "
                 "https://discord.gg/4stCdkDHw6 if you have any questions.\n\n"
              << std::flush;

    std::cout << "Starting bot...\n\n";

    std::string token = getToken();
    if (token.empty()) {
        std::cerr << "CRITICAL: "
                  << "There is no valid way for Echo to obtain a token! Use "
                     "one of the following ways:"
                  << std::endl
                  << "(1) Fill the BOT_TOKEN environment variable with the "
                     "token (e.g. 'Bot 123456abcdef')."
                  << std::endl
                  << "(2) Copy the example `token.eg.dat` as `token.dat` and "
                     "write your own token to it.\n";
        exit(1);
    }

    // Create Bot object
    auto bot = std::make_shared<DppBot>();

    // Don't complain about unhandled events
    bot->debugUnhandled = true;

    // Declare the intent to receive guild messages
    // You don't need `NONE` it's just to show you how to declare multiple
    bot->intents = dpp::intents::NONE | dpp::intents::GUILD_MESSAGES;

    /*/
     * Create handler for the READY payload, this may be handled by the bot in
    the future.
     * The `self` object contains all information about the 'bot' user.
    /*/
    dpp::User self;
    bot->handlers.insert(
        {"READY", [&self](dpp::ReadyEvent ready) { self = *ready.user; }});

    bot->prefix = "~";

    bot->respond("help", "Mention me and I'll echo your message back!");

    bot->respond("about", [&bot](dpp::MessageCreateEvent msg) {
        std::ostringstream content;
        content << "Sure thing, "
                << *(msg.member->nick ? msg.author->username : msg.member->nick)
                << "!\n"
                << "I'm a simple bot meant to demonstrate the "
                   "Discord++ library.\n"
                << "You can learn more about Discord++ at "
                   "https://discord.gg/4stCdkDHw6";
        bot->createMessage()
            ->channel_id(*msg.channel_id)
            ->content(content.str())
            ->run();
    });

    bot->respond("lookatthis", [&bot](dpp::MessageCreateEvent msg) {
        std::ifstream ifs("image.jpg", std::ios::binary);
        if (!ifs) {
            std::cerr << "Couldn't load file 'image.jpg'!\n";
            return;
        }
        ifs.seekg(0, std::ios::end);
        std::ifstream::pos_type fileSize = ifs.tellg();
        ifs.seekg(0, std::ios::beg);
        auto file = std::make_shared<std::string>(fileSize, '\0');
        ifs.read(file->data(), fileSize);

        bot->createMessage()
            ->channel_id(*msg.channel_id)
            ->content("Look at this photograph")
            ->filename("image.jpg")
            ->filetype("image/jpg")
            ->file(file)
            ->run();
    });

    bot->respond("channelinfo", [&bot](dpp::MessageCreateEvent msg) {
        bot->getChannel()
            ->channel_id(*msg.channel_id)
            ->onRead([&bot, msg](bool error, json res) {
                bot->createMessage()
                    ->channel_id(*msg.channel_id)
                    ->content("```json\n" + res["body"].dump(4) + "\n```")
                    ->run();
            })
            ->run();
    });

    bot->respond("registerslash", [&bot, &self](dpp::MessageCreateEvent msg) {
        if (*msg.author->id == 106615803402547200) {
            bot->createGuildApplicationCommand()
                ->application_id(*self.id)
                ->guild_id(*msg.guild_id)
                ->name("echo")
                ->description("Echoes what you say")
                ->options({dpp::ApplicationCommandOption(
                    dpp::ApplicationCommandOptionType::STRING,
                    std::string("message"), dpp::omitted, std::string("The message to echo"),
                    dpp::omitted, true)})
                ->command_type(dpp::ApplicationCommandType::CHAT_INPUT)
                ->onRead([](bool error, json res) {
                    std::cout << res.dump(4) << std::endl;
                })
                ->run();
        }
    });

    bot->interactionHandlers.insert(
        {881674285683470376, [&bot](dpp::Interaction msg) {
             bot->createResponse()
                 ->interaction_id(*msg.id)
                 ->interaction_token(*msg.token)
                 ->interaction_type(
                     dpp::InteractionCallbackType::CHANNEL_MESSAGE_WITH_SOURCE)
                 ->data({{
                     "content",
                     *std::get<dpp::ApplicationCommandData>(*msg.data).options->at(0).value
                 }})
                 ->run();
         }});

    // Create handler for the MESSAGE_CREATE payload, this receives all messages
    // sent that the bot can see.
    bot->handlers.insert(
        {"MESSAGE_CREATE", [&bot, &self](const dpp::MessageCreateEvent msg) {
             // Ignore messages from other bots
             if (msg.webhook_id || (msg.author->bot && *msg.author->bot)) {
                 return;
             }

             // Scan through mentions in the message for self
             bool mentioned = false;
             for (const dpp::User &mention : *msg.mentions) {
                 mentioned = mentioned || (*mention.id == *self.id);
             }
             if (mentioned) {
                 // Identify and remove mentions of self from the message
                 std::string content = *msg.content;
                 unsigned int oldlength, length = content.length();
                 do {
                     oldlength = length;
                     content = std::regex_replace(
                         content,
                         std::regex(R"(<@!?)" + std::to_string(*self.id) +
                                    R"(> ?)"),
                         "");
                     length = content.length();
                 } while (oldlength > length);

                 // Get the target user's display name
                 std::string name = *(msg.member->nick ? msg.member->nick
                                                       : msg.author->username);

                 std::cout << "Echoing " << name << '\n';

                 // Echo the created message
                 bot->createMessage()
                     ->channel_id(*msg.channel_id)
                     ->content(content)
                     ->run();

                 // Set status to Playing "with [author]"
                 bot->send(3,
                           {{"game", {{"name", "with " + name}, {"type", 0}}},
                            {"status", "online"},
                            {"afk", false},
                            {"since", "null"}});
             }
         }});

    // Create Asio context, this handles async stuff.
    auto aioc = std::make_shared<asio::io_context>();

    // Set the bot up
    bot->initBot(9, token, aioc);

    // Run the bot!
    bot->run();

    return 0;
}